

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O2

CPToken cp_next(CPState *cp)

{
  SBuf *sb;
  CPChar CVar1;
  byte *pbVar2;
  uint8_t *p;
  TValue *pTVar3;
  lua_State *L;
  double dVar4;
  byte bVar5;
  CTypeID CVar6;
  StrScanFmt SVar7;
  uint uVar8;
  uint uVar9;
  anon_union_4_2_43a9a9ed_for_CPValue_0 aVar10;
  uint uVar11;
  char *pcVar12;
  GCstr *pGVar13;
  int iVar14;
  ulong uVar15;
  ErrMsg em;
  char cVar16;
  int iVar17;
  CPToken c;
  TValue local_38;
  
  sb = &cp->sb;
  (cp->sb).w = (cp->sb).b;
LAB_001493c4:
  uVar11 = cp->c;
  if ((char)""[(long)(int)uVar11 + 1] < '\0') goto LAB_00149512;
  switch(uVar11) {
  case 0x20:
    goto switchD_0014940d_caseD_20;
  case 0x21:
    pbVar2 = (byte *)cp->p;
    cp->p = (char *)(pbVar2 + 1);
    bVar5 = *pbVar2;
    uVar11 = (uint)bVar5;
    cp->c = (uint)bVar5;
    if (bVar5 == 0x5c) {
      uVar11 = cp_get_bs(cp);
    }
    if (uVar11 != 0x3d) {
      uVar11 = 0x21;
      goto LAB_00149dc8;
    }
    pbVar2 = (byte *)cp->p;
    cp->p = (char *)(pbVar2 + 1);
    bVar5 = *pbVar2;
    cp->c = (uint)bVar5;
    uVar11 = 0x107;
    break;
  case 0x22:
  case 0x27:
    pbVar2 = (byte *)cp->p;
    cp->p = (char *)(pbVar2 + 1);
    uVar9 = (uint)*pbVar2;
    cp->c = uVar9;
    if (uVar9 == 0x5c) {
      cp_get_bs(cp);
    }
    goto LAB_0014970f;
  case 0x23:
  case 0x25:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2e:
switchD_0014940d_caseD_23:
    pbVar2 = (byte *)cp->p;
    cp->p = (char *)(pbVar2 + 1);
    bVar5 = *pbVar2;
    cp->c = (uint)bVar5;
    break;
  case 0x24:
    pbVar2 = (byte *)cp->p;
    cp->p = (char *)(pbVar2 + 1);
    bVar5 = *pbVar2;
    uVar11 = (uint)bVar5;
    cp->c = (uint)bVar5;
    if (bVar5 == 0x5c) {
      uVar11 = cp_get_bs(cp);
    }
    if ((uVar11 == 0x24) || ((char)""[(long)(int)uVar11 + 1] < '\0')) {
      em = LJ_ERR_XSYNTAX;
      goto LAB_00149e7f;
    }
    pTVar3 = cp->param;
    if ((pTVar3 == (TValue *)0x0) || (L = cp->L, L->top <= pTVar3)) {
      cp_err(cp,LJ_ERR_FFI_NUMPARAM);
    }
    cp->param = pTVar3 + 1;
    dVar4 = pTVar3->n;
    uVar15 = (long)dVar4 >> 0x2f;
    if (uVar15 == 0xfffffffffffffffb) {
      cp->str = (GCstr *)((ulong)dVar4 & 0x7fffffffffff);
      (cp->val).id = 0;
      cp->ct = cp->cts->tab;
      uVar11 = 0x100;
      goto LAB_00149dc8;
    }
    if (uVar15 < 0xfffffffffffffff3) {
      aVar10.i32 = (int32_t)dVar4;
      goto LAB_00149d26;
    }
    if (uVar15 != 0xfffffffffffffff5) {
      lj_err_argtype(L,(int)((ulong)((long)pTVar3 - (long)L->base) >> 3) + 1,"type parameter");
    }
    uVar11 = (uint)*(ushort *)(((ulong)dVar4 & 0x7fffffffffff) + 10);
    if (uVar11 == 0x16) {
      (cp->val).id = *(CTypeID *)(((ulong)dVar4 & 0x7fffffffffff) + 0x10);
    }
    else {
      (cp->val).id = uVar11;
    }
    uVar11 = 0x24;
    goto LAB_00149dc8;
  case 0x26:
    pbVar2 = (byte *)cp->p;
    cp->p = (char *)(pbVar2 + 1);
    bVar5 = *pbVar2;
    uVar11 = (uint)bVar5;
    cp->c = (uint)bVar5;
    if (bVar5 == 0x5c) {
      uVar11 = cp_get_bs(cp);
    }
    if (uVar11 != 0x26) {
      uVar11 = 0x26;
      goto LAB_00149dc8;
    }
    pbVar2 = (byte *)cp->p;
    cp->p = (char *)(pbVar2 + 1);
    bVar5 = *pbVar2;
    cp->c = (uint)bVar5;
    uVar11 = 0x105;
    break;
  case 0x2d:
    pbVar2 = (byte *)cp->p;
    cp->p = (char *)(pbVar2 + 1);
    bVar5 = *pbVar2;
    uVar11 = (uint)bVar5;
    cp->c = (uint)bVar5;
    if (bVar5 == 0x5c) {
      uVar11 = cp_get_bs(cp);
    }
    if (uVar11 != 0x3e) {
      uVar11 = 0x2d;
      goto LAB_00149dc8;
    }
    pbVar2 = (byte *)cp->p;
    cp->p = (char *)(pbVar2 + 1);
    bVar5 = *pbVar2;
    cp->c = (uint)bVar5;
    uVar11 = 0x10c;
    break;
  case 0x2f:
    pbVar2 = (byte *)cp->p;
    cp->p = (char *)(pbVar2 + 1);
    bVar5 = *pbVar2;
    uVar11 = (uint)bVar5;
    cp->c = (uint)bVar5;
    if (bVar5 == 0x5c) {
      uVar11 = cp_get_bs(cp);
    }
    if (uVar11 != 0x2a) {
      if (cp->c == 0x2f) goto LAB_001494c9;
      uVar11 = 0x2f;
      goto LAB_00149dc8;
    }
    do {
      pbVar2 = (byte *)cp->p;
      cp->p = (char *)(pbVar2 + 1);
      bVar5 = *pbVar2;
      uVar11 = (uint)bVar5;
      cp->c = (uint)bVar5;
      if (bVar5 == 0x5c) {
        uVar11 = cp_get_bs(cp);
      }
      if (uVar11 == 0x2a) {
        do {
          pbVar2 = (byte *)cp->p;
          cp->p = (char *)(pbVar2 + 1);
          bVar5 = *pbVar2;
          uVar11 = (uint)bVar5;
          cp->c = (uint)bVar5;
          if (bVar5 == 0x5c) {
            uVar11 = cp_get_bs(cp);
          }
          if (uVar11 == 0x2f) goto switchD_0014940d_caseD_20;
          iVar17 = cp->c;
        } while (iVar17 == 0x2a);
      }
      else {
        iVar17 = cp->c;
      }
      if ((iVar17 == 0xd) || (iVar17 == 10)) {
        cp_newline(cp);
        iVar17 = cp->c;
      }
    } while (iVar17 != 0);
    goto LAB_001493c4;
  default:
    if ((1 < uVar11 - 0xb) && (uVar11 != 9)) {
      if ((uVar11 != 10) && (uVar11 != 0xd)) {
        if (uVar11 == 0) {
          uVar11 = 0x103;
          goto LAB_00149dc8;
        }
        if (uVar11 == 0x3c) {
          pbVar2 = (byte *)cp->p;
          cp->p = (char *)(pbVar2 + 1);
          bVar5 = *pbVar2;
          uVar11 = (uint)bVar5;
          cp->c = (uint)bVar5;
          if (bVar5 == 0x5c) {
            uVar11 = cp_get_bs(cp);
          }
          if (uVar11 == 0x3d) {
            pbVar2 = (byte *)cp->p;
            cp->p = (char *)(pbVar2 + 1);
            bVar5 = *pbVar2;
            cp->c = (uint)bVar5;
            uVar11 = 0x108;
          }
          else {
            if (cp->c != 0x3c) {
              uVar11 = 0x3c;
              goto LAB_00149dc8;
            }
            pbVar2 = (byte *)cp->p;
            cp->p = (char *)(pbVar2 + 1);
            bVar5 = *pbVar2;
            cp->c = (uint)bVar5;
            uVar11 = 0x10a;
          }
        }
        else if (uVar11 == 0x3d) {
          pbVar2 = (byte *)cp->p;
          cp->p = (char *)(pbVar2 + 1);
          bVar5 = *pbVar2;
          uVar11 = (uint)bVar5;
          cp->c = (uint)bVar5;
          if (bVar5 == 0x5c) {
            uVar11 = cp_get_bs(cp);
          }
          if (uVar11 != 0x3d) {
            uVar11 = 0x3d;
            goto LAB_00149dc8;
          }
          pbVar2 = (byte *)cp->p;
          cp->p = (char *)(pbVar2 + 1);
          bVar5 = *pbVar2;
          cp->c = (uint)bVar5;
          uVar11 = 0x106;
        }
        else {
          if (uVar11 != 0x3e) {
            if (uVar11 != 0x7c) goto switchD_0014940d_caseD_23;
            pbVar2 = (byte *)cp->p;
            cp->p = (char *)(pbVar2 + 1);
            bVar5 = *pbVar2;
            uVar11 = (uint)bVar5;
            cp->c = (uint)bVar5;
            if (bVar5 == 0x5c) {
              uVar11 = cp_get_bs(cp);
            }
            if (uVar11 == 0x7c) {
              pbVar2 = (byte *)cp->p;
              cp->p = (char *)(pbVar2 + 1);
              bVar5 = *pbVar2;
              cp->c = (uint)bVar5;
              uVar11 = 0x104;
              break;
            }
            uVar11 = 0x7c;
            goto LAB_00149dc8;
          }
          pbVar2 = (byte *)cp->p;
          cp->p = (char *)(pbVar2 + 1);
          bVar5 = *pbVar2;
          uVar11 = (uint)bVar5;
          cp->c = (uint)bVar5;
          if (bVar5 == 0x5c) {
            uVar11 = cp_get_bs(cp);
          }
          if (uVar11 == 0x3d) {
            pbVar2 = (byte *)cp->p;
            cp->p = (char *)(pbVar2 + 1);
            bVar5 = *pbVar2;
            cp->c = (uint)bVar5;
            uVar11 = 0x109;
          }
          else {
            if (cp->c != 0x3e) {
              uVar11 = 0x3e;
              goto LAB_00149dc8;
            }
            pbVar2 = (byte *)cp->p;
            cp->p = (char *)(pbVar2 + 1);
            bVar5 = *pbVar2;
            cp->c = (uint)bVar5;
            uVar11 = 0x10b;
          }
        }
        break;
      }
      cp_newline(cp);
    }
switchD_0014940d_caseD_20:
    pbVar2 = (byte *)cp->p;
    cp->p = (char *)(pbVar2 + 1);
    uVar11 = (uint)*pbVar2;
    cp->c = uVar11;
    if (uVar11 == 0x5c) {
      cp_get_bs(cp);
    }
    goto LAB_001493c4;
  }
  if (bVar5 == 0x5c) {
    cp_get_bs(cp);
  }
  goto LAB_00149dc8;
LAB_001494c9:
  do {
    pbVar2 = (byte *)cp->p;
    cp->p = (char *)(pbVar2 + 1);
    bVar5 = *pbVar2;
    uVar11 = (uint)bVar5;
    cp->c = (uint)bVar5;
    if (bVar5 == 0x5c) {
      uVar11 = cp_get_bs(cp);
    }
  } while (((uVar11 != 10) && (uVar11 != 0xd)) && (cp->c != 0));
  goto LAB_001493c4;
LAB_0014970f:
  uVar9 = cp->c;
  if (uVar9 == uVar11) goto LAB_00149a61;
  if (uVar9 != 0x5c) {
    if (uVar9 != 0) goto switchD_0014977b_caseD_61;
LAB_00149e72:
    uVar11 = 0x103;
    em = LJ_ERR_XSTR;
    goto LAB_00149e7f;
  }
  pbVar2 = (byte *)cp->p;
  cp->p = (char *)(pbVar2 + 1);
  bVar5 = *pbVar2;
  uVar8 = (uint)bVar5;
  cp->c = (uint)bVar5;
  if (bVar5 == 0x5c) {
    uVar8 = cp_get_bs(cp);
  }
  switch(uVar8) {
  case 0x6e:
    uVar9 = 10;
    break;
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x73:
  case 0x75:
  case 0x77:
    goto switchD_0014975a_caseD_6f;
  case 0x72:
    uVar9 = 0xd;
    break;
  case 0x74:
    uVar9 = 9;
    break;
  case 0x76:
    uVar9 = 0xb;
    break;
  case 0x78:
    iVar17 = 0;
    while( true ) {
      pbVar2 = (byte *)cp->p;
      cp->p = (char *)(pbVar2 + 1);
      bVar5 = *pbVar2;
      uVar9 = (uint)bVar5;
      cp->c = (uint)bVar5;
      if (bVar5 == 0x5c) {
        uVar9 = cp_get_bs(cp);
      }
      if ((""[(long)(int)uVar9 + 1] & 0x10) == 0) break;
      uVar9 = cp->c;
      iVar14 = (uVar9 & 0xf) + 9;
      if ((""[(long)(int)uVar9 + 1] & 8) != 0) {
        iVar14 = uVar9 - 0x30;
      }
      iVar17 = iVar17 * 0x10 + iVar14;
    }
    pcVar12 = (cp->sb).w;
    if (*(int *)&(cp->sb).e == (int)pcVar12) {
      pcVar12 = lj_buf_more2(sb,1);
    }
    *pcVar12 = (char)iVar17;
    goto LAB_00149915;
  default:
    uVar9 = 7;
    switch(uVar8) {
    case 0x61:
      break;
    case 0x62:
      uVar9 = 8;
      break;
    case 99:
    case 100:
      goto switchD_0014975a_caseD_6f;
    case 0x65:
      uVar9 = 0x1b;
      break;
    case 0x66:
      uVar9 = 0xc;
      break;
    default:
      if (uVar8 == 0) goto LAB_00149e72;
switchD_0014975a_caseD_6f:
      uVar9 = uVar8;
      if ((""[(long)(int)uVar8 + 1] & 8) == 0) break;
      pbVar2 = (byte *)cp->p;
      cp->p = (char *)(pbVar2 + 1);
      bVar5 = *pbVar2;
      uVar9 = (uint)bVar5;
      cp->c = (uint)bVar5;
      if (bVar5 == 0x5c) {
        uVar9 = cp_get_bs(cp);
      }
      cVar16 = (char)uVar8 + -0x30;
      if ((""[(long)(int)uVar9 + 1] & 8) != 0) {
        CVar1 = cp->c;
        pbVar2 = (byte *)cp->p;
        cp->p = (char *)(pbVar2 + 1);
        bVar5 = *pbVar2;
        uVar9 = (uint)bVar5;
        cp->c = (uint)bVar5;
        if (bVar5 == 0x5c) {
          uVar9 = cp_get_bs(cp);
        }
        cVar16 = (char)CVar1 + -0x30 + cVar16 * '\b';
        if ((""[(long)(int)uVar9 + 1] & 8) != 0) {
          cVar16 = (char)cp->c + cVar16 * '\b' + -0x30;
          pbVar2 = (byte *)cp->p;
          cp->p = (char *)(pbVar2 + 1);
          uVar9 = (uint)*pbVar2;
          cp->c = uVar9;
          if (uVar9 == 0x5c) {
            cp_get_bs(cp);
          }
        }
      }
      pcVar12 = (cp->sb).w;
      if (*(int *)&(cp->sb).e == (int)pcVar12) {
        pcVar12 = lj_buf_more2(sb,1);
      }
      *pcVar12 = cVar16;
LAB_00149915:
      sb->w = pcVar12 + 1;
      goto LAB_0014970f;
    }
  }
switchD_0014977b_caseD_61:
  pcVar12 = (cp->sb).w;
  if (*(int *)&(cp->sb).e == (int)pcVar12) {
    pcVar12 = lj_buf_more2(sb,1);
  }
  *pcVar12 = (char)uVar9;
  (cp->sb).w = pcVar12 + 1;
  pbVar2 = (byte *)cp->p;
  cp->p = (char *)(pbVar2 + 1);
  uVar9 = (uint)*pbVar2;
  cp->c = uVar9;
  if (uVar9 == 0x5c) {
    cp_get_bs(cp);
  }
  goto LAB_0014970f;
LAB_00149512:
  if ((""[(long)(int)uVar11 + 1] & 8) == 0) {
    do {
      CVar1 = cp->c;
      pcVar12 = (cp->sb).w;
      if (*(int *)&(cp->sb).e == (int)pcVar12) {
        pcVar12 = lj_buf_more2(sb,1);
      }
      *pcVar12 = (char)CVar1;
      (cp->sb).w = pcVar12 + 1;
      pbVar2 = (byte *)cp->p;
      cp->p = (char *)(pbVar2 + 1);
      bVar5 = *pbVar2;
      uVar11 = (uint)bVar5;
      cp->c = (uint)bVar5;
      if (bVar5 == 0x5c) {
        uVar11 = cp_get_bs(cp);
      }
    } while ((char)""[(long)(int)uVar11 + 1] < '\0');
    pcVar12 = (cp->sb).b;
    pGVar13 = lj_str_new(cp->L,pcVar12,(ulong)(uint)(*(int *)&(cp->sb).w - (int)pcVar12));
    cp->str = pGVar13;
    CVar6 = lj_ctype_getname(cp->cts,&cp->ct,pGVar13,cp->tmask);
    (cp->val).id = CVar6;
    uVar9 = cp->ct->info;
    uVar11 = 0x100;
    if ((uVar9 & 0xf0000000) == 0xd0000000) {
      uVar11 = uVar9 & 0xffff;
    }
    goto LAB_00149dc8;
  }
  CVar6 = 9;
  do {
    CVar1 = cp->c;
    pcVar12 = (cp->sb).w;
    if (*(int *)&(cp->sb).e == (int)pcVar12) {
      pcVar12 = lj_buf_more2(sb,1);
    }
    *pcVar12 = (char)CVar1;
    (cp->sb).w = pcVar12 + 1;
    pbVar2 = (byte *)cp->p;
    cp->p = (char *)(pbVar2 + 1);
    bVar5 = *pbVar2;
    uVar11 = (uint)bVar5;
    cp->c = (uint)bVar5;
    if (bVar5 == 0x5c) {
      uVar11 = cp_get_bs(cp);
    }
  } while ((char)""[(long)(int)uVar11 + 1] < '\0');
  pcVar12 = (cp->sb).w;
  if (*(int *)&(cp->sb).e == (int)pcVar12) {
    pcVar12 = lj_buf_more2(sb,1);
  }
  *pcVar12 = '\0';
  (cp->sb).w = pcVar12 + 1;
  p = (uint8_t *)(cp->sb).b;
  SVar7 = lj_strscan_scan(p,~(uint)p + (int)(pcVar12 + 1),&local_38,0x10);
  if (SVar7 == STRSCAN_INT) {
LAB_001496c8:
    (cp->val).id = CVar6;
  }
  else {
    if (SVar7 == STRSCAN_U32) {
      CVar6 = 10;
      goto LAB_001496c8;
    }
    if ((cp->mode & 0x20) == 0) {
      uVar11 = 0x102;
      em = LJ_ERR_XNUMBER;
LAB_00149e7f:
      cp_errmsg(cp,uVar11,em);
    }
  }
  (cp->val).field_0 = (anon_union_4_2_43a9a9ed_for_CPValue_0)local_38.field_4.i;
  goto LAB_00149d30;
LAB_00149a61:
  pbVar2 = (byte *)cp->p;
  cp->p = (char *)(pbVar2 + 1);
  uVar9 = (uint)*pbVar2;
  cp->c = uVar9;
  if (uVar9 == 0x5c) {
    cp_get_bs(cp);
  }
  if (uVar11 == 0x22) {
    pcVar12 = (cp->sb).b;
    pGVar13 = lj_str_new(cp->L,pcVar12,(ulong)(uint)(*(int *)&(cp->sb).w - (int)pcVar12));
    cp->str = pGVar13;
    uVar11 = 0x101;
    goto LAB_00149dc8;
  }
  pcVar12 = (cp->sb).b;
  if (*(int *)&(cp->sb).w - (int)pcVar12 != 1) {
    cp_err_token(cp,0x27);
  }
  aVar10 = (anon_union_4_2_43a9a9ed_for_CPValue_0)(int)*pcVar12;
LAB_00149d26:
  (cp->val).field_0 = aVar10;
  (cp->val).id = 9;
LAB_00149d30:
  uVar11 = 0x102;
LAB_00149dc8:
  cp->tok = uVar11;
  return uVar11;
}

Assistant:

static LJ_NOINLINE CPToken cp_next(CPState *cp)
{
  return (cp->tok = cp_next_(cp));
}